

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

char * unshield_get_base_directory_name(Unshield *unshield)

{
  char *__s;
  char *pcVar1;
  char *__dest;
  
  __s = unshield->filename_pattern;
  pcVar1 = strrchr(__s,0x2f);
  __dest = (char *)malloc(0x1000);
  if (pcVar1 == (char *)0x0) {
    __dest[0] = '.';
    __dest[1] = '\0';
  }
  else {
    strncpy(__dest,__s,0x1000);
    if ((uint)((long)pcVar1 - (long)__s) < 0x1001) {
      __dest[(long)pcVar1 - (long)__s] = '\0';
    }
    else {
      __dest[0xfff] = '\0';
    }
  }
  return __dest;
}

Assistant:

char *unshield_get_base_directory_name(Unshield *unshield) {
    long int path_max = unshield_get_path_max(unshield);
    char *p = unshield_get_last_path_separator(unshield->filename_pattern);
    char *dirname = malloc(path_max);

    if (p) {
        strncpy(dirname, unshield->filename_pattern, path_max);
        if ((unsigned int) (p - unshield->filename_pattern) > path_max) {
            dirname[path_max - 1] = 0;
        } else
            dirname[(p - unshield->filename_pattern)] = 0;
    } else
        strcpy(dirname, ".");

    return dirname;
}